

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSaucy.c
# Opt level: O0

int descend(saucy *s,coloring *c,int target,int min)

{
  int iVar1;
  int back;
  int min_local;
  int target_local;
  coloring *c_local;
  saucy *s_local;
  
  iVar1 = target + c->clen[target];
  s->stats->nodes = s->stats->nodes + 1;
  swap_labels(c,min,iVar1);
  s->difflev[s->lev] = s->ndiffs;
  s->undifflev[s->lev] = s->nundiffs;
  s->lev = s->lev + 1;
  (*s->split)(s,c,target,iVar1);
  iVar1 = refineByDepGraph(s,c);
  if (iVar1 == 0) {
    s_local._4_4_ = 0;
  }
  else {
    if ((s->fBooleanMatching != 0) && (iVar1 = check_OPP_for_Boolean_matching(s,c), iVar1 == 0)) {
      return 0;
    }
    if ((s->fBooleanMatching != 0) && (iVar1 = check_OPP_for_Boolean_matching(s,c), iVar1 == 0)) {
      return 0;
    }
    if ((s->fLookForSwaps != 0) && (iVar1 = check_OPP_only_has_swaps(s,c), iVar1 == 0)) {
      return 0;
    }
    iVar1 = double_check_OPP_isomorphism(s,c);
    if (iVar1 == 0) {
      s_local._4_4_ = 0;
    }
    else {
      s_local._4_4_ = 1;
    }
  }
  return s_local._4_4_;
}

Assistant:

static int
descend(struct saucy *s, struct coloring *c, int target, int min)
{
    int back = target + c->clen[target];

    /* Count this node */
    ++s->stats->nodes;

    /* Move the minimum label to the back */
    swap_labels(c, min, back);

    /* Split the cell */
    s->difflev[s->lev] = s->ndiffs;
    s->undifflev[s->lev] = s->nundiffs;
    ++s->lev;
    s->split(s, c, target, back);   

    /* Now go and do some work */
    //print_partition(&s->left, NULL, s->n, s->pNtk, 1);    
    if (!refineByDepGraph(s, c)) return 0;

    /* if we are looking for a Boolean matching, check the OPP and 
     * backtrack if the OPP maps part of one network to itself */
    if (s->fBooleanMatching && !check_OPP_for_Boolean_matching(s, c)) return 0;

    //print_partition(&s->left, NULL, s->n, s->pNtk, 1);
    if (REFINE_BY_SIM_1 && !s->refineBySim1(s, c)) return 0;

    //print_partition(&s->left, NULL, s->n, s->pNtk, 1);
    if (REFINE_BY_SIM_2 && !s->refineBySim2(s, c)) return 0;

    /* do the check once more, maybe the check fails, now that refinement is complete */
    if (s->fBooleanMatching && !check_OPP_for_Boolean_matching(s, c)) return 0;

    if (s->fLookForSwaps && !check_OPP_only_has_swaps(s, c)) return 0;

    if (!double_check_OPP_isomorphism(s, c)) return 0;
    
    return 1;
}